

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteUint(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,uint u)

{
  char *buffer;
  char *pcVar1;
  
  buffer = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,10);
  pcVar1 = internal::u32toa(u,buffer);
  internal::Stack<rapidjson::CrtAllocator>::Pop<char>
            (&this->os_->stack_,(size_t)(buffer + (10 - (long)pcVar1)));
  return true;
}

Assistant:

inline bool Writer<StringBuffer>::WriteUint(unsigned u) {
    char *buffer = os_->Push(10);
    const char* end = internal::u32toa(u, buffer);
    os_->Pop(static_cast<size_t>(10 - (end - buffer)));
    return true;
}